

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O3

void capnp::_::
     checkList<capnp::List<float,_(capnp::Kind)0>::Builder,_capnp::List<float,_(capnp::Kind)0>,_false>
               (Builder reader,initializer_list<float> expected)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Fault f;
  ulong local_68;
  ListElementCount local_5c;
  DebugComparison<unsigned_long,_unsigned_int> _kjCondition;
  
  uVar3 = expected._M_len;
  _kjCondition.right = reader.builder.elementCount;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = reader.builder.elementCount == uVar3;
  if (_kjCondition.result) {
    if (uVar3 != 0) {
      uVar2 = 0;
      uVar4 = 1;
      _kjCondition.left = uVar3;
      do {
        fVar1 = expected._M_array[uVar2];
        f.exception._0_4_ = *(float *)(reader.builder.ptr + (uVar2 * reader.builder.step >> 3));
        _kjCondition.left = CONCAT44(_kjCondition.left._4_4_,fVar1);
        if ((f.exception._0_4_ != fVar1) || (NAN(f.exception._0_4_) || NAN(fVar1))) {
          fVar7 = f.exception._0_4_ - fVar1;
          fVar8 = -fVar7;
          if (-fVar7 <= fVar7) {
            fVar8 = fVar7;
          }
          fVar7 = -f.exception._0_4_;
          if (-f.exception._0_4_ <= f.exception._0_4_) {
            fVar7 = f.exception._0_4_;
          }
          fVar6 = -fVar1;
          if (-fVar1 <= fVar1) {
            fVar6 = fVar1;
          }
          fVar1 = (fVar6 + fVar7) * 1e-05;
          local_68 = CONCAT71(local_68._1_7_,fVar8 < fVar1);
          if ((fVar1 <= fVar8) && (kj::_::Debug::minSeverity < 3)) {
            kj::_::Debug::log<char_const(&)[49],kj::_::DebugExpression<bool>&,float&,float&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.h"
                       ,0x77,ERROR,
                       "\"failed: expected \" \"::kj::_::floatAlmostEqual(b, a)\", _kjCondition, b, a"
                       ,(char (*) [49])"failed: expected ::kj::_::floatAlmostEqual(b, a)",
                       (DebugExpression<bool> *)&local_68,(float *)&f,(float *)&_kjCondition);
          }
        }
        bVar5 = uVar4 < uVar3;
        uVar2 = uVar4;
        uVar4 = (ulong)((int)uVar4 + 1);
      } while (bVar5);
    }
    return;
  }
  local_5c = reader.builder.elementCount;
  local_68 = uVar3;
  _kjCondition.left = uVar3;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int>&,unsigned_long,unsigned_int>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.h"
             ,0x89,FAILED,"(expected.size()) == (reader.size())",
             "_kjCondition,expected.size(), reader.size()",&_kjCondition,&local_68,&local_5c);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void checkList(T reader, std::initializer_list<decltype(typename L::Reader()[0])> expected) {
  ASSERT_EQ(expected.size(), reader.size());
  for (uint i = 0; i < expected.size(); i++) {
    checkElement<decltype(typename L::Reader()[0])>(expected.begin()[i], reader[i]);
  }
}